

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.h
# Opt level: O3

vector<Point2D,_std::allocator<Point2D>_> * __thiscall
lazyTrees::LazyKdTree<Point2D>::in_box
          (vector<Point2D,_std::allocator<Point2D>_> *__return_storage_ptr__,
          LazyKdTree<Point2D> *this,Point2D *search,Point2D *sizes)

{
  vector<Point2D,std::allocator<Point2D>> *pvVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Point2D *pPVar7;
  iterator __position;
  LazyKdTree<Point2D> *pLVar8;
  void *pvVar9;
  byte bVar10;
  bool bVar11;
  double *pdVar12;
  bool bVar13;
  size_t sVar14;
  void *pvVar15;
  vector<Point2D,_std::allocator<Point2D>_> local_88;
  
  ensure_evaluated(this);
  sVar14 = 0;
  bVar11 = true;
  do {
    bVar13 = bVar11;
    pdVar12 = Point2D::operator[](sizes,sVar14);
    if (*pdVar12 <= 0.0) {
      (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    }
    sVar14 = 1;
    bVar11 = false;
  } while (bVar13);
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar10 = 1;
  sVar14 = 0;
  do {
    pPVar7 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
             super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
             super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
    pdVar12 = Point2D::operator[](search,sVar14);
    dVar2 = *pdVar12;
    pdVar12 = Point2D::operator[](pPVar7,sVar14);
    dVar3 = *pdVar12;
    pdVar12 = Point2D::operator[](sizes,sVar14);
    sVar14 = 1;
    bVar11 = (bool)(bVar10 & ABS(dVar2 - dVar3) <= *pdVar12 * 0.5);
    bVar10 = 0;
  } while (bVar11);
  if (ABS(dVar2 - dVar3) <= *pdVar12 * 0.5) {
    pPVar7 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
             super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
             super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
    __position._M_current =
         *(Point2D **)
          &(__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        *(Point2D **)
         &(__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
      std::vector<Point2D,std::allocator<Point2D>>::_M_realloc_insert<Point2D_const&>
                ((vector<Point2D,std::allocator<Point2D>> *)__return_storage_ptr__,__position,pPVar7
                );
    }
    else {
      dVar2 = pPVar7->y;
      (__position._M_current)->x = pPVar7->x;
      (__position._M_current)->y = dVar2;
      pvVar1 = (vector<Point2D,std::allocator<Point2D>> *)
               &(__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      *(long *)pvVar1 = *(long *)pvVar1 + 0x10;
    }
  }
  if ((this->childPositive)._M_t.
      super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
      (LazyKdTree<Point2D> *)0x0 &&
      (this->childNegative)._M_t.
      super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
      (LazyKdTree<Point2D> *)0x0) {
    return __return_storage_ptr__;
  }
  pPVar7 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
           super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
           super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
  sVar14 = this->dim;
  pdVar12 = Point2D::operator[](search,sVar14);
  dVar2 = *pdVar12;
  pdVar12 = Point2D::operator[](pPVar7,sVar14);
  dVar3 = *pdVar12;
  if (dVar2 <= dVar3) {
    pLVar8 = (this->childNegative)._M_t.
             super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
    if (pLVar8 != (LazyKdTree<Point2D> *)0x0) {
      in_box(&local_88,pLVar8,search,sizes);
      pvVar15 = *(void **)&__return_storage_ptr__->
                           super__Vector_base<Point2D,_std::allocator<Point2D>_>;
      pvVar9 = *(void **)&(__return_storage_ptr__->
                          super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
      if (pvVar15 == pvVar9) goto LAB_00144178;
      std::vector<Point2D,_std::allocator<Point2D>_>::reserve
                (__return_storage_ptr__,
                 ((long)local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_start >> 4) + ((long)pvVar9 - (long)pvVar15 >> 4)
                );
      std::vector<Point2D,std::allocator<Point2D>>::
      _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<Point2D*,std::vector<Point2D,std::allocator<Point2D>>>>>
                ((vector<Point2D,std::allocator<Point2D>> *)__return_storage_ptr__,
                 *(undefined8 *)
                  &(__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                 local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      goto LAB_001441a6;
    }
  }
  else {
    pLVar8 = (this->childPositive)._M_t.
             super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
    if (pLVar8 != (LazyKdTree<Point2D> *)0x0) {
      in_box(&local_88,pLVar8,search,sizes);
      pvVar15 = *(void **)&__return_storage_ptr__->
                           super__Vector_base<Point2D,_std::allocator<Point2D>_>;
      pvVar9 = *(void **)&(__return_storage_ptr__->
                          super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
      if (pvVar15 == pvVar9) {
LAB_00144178:
        *(pointer *)&__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_> =
             local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         &(__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
          super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
             super__Vector_impl_data._M_finish;
        *(pointer *)
         &(__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage =
             local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pvVar15 == (void *)0x0) goto LAB_001441b4;
        operator_delete(pvVar15);
      }
      else {
        std::vector<Point2D,_std::allocator<Point2D>_>::reserve
                  (__return_storage_ptr__,
                   ((long)local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                          super__Vector_impl_data._M_start >> 4) +
                   ((long)pvVar9 - (long)pvVar15 >> 4));
        std::vector<Point2D,std::allocator<Point2D>>::
        _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<Point2D*,std::vector<Point2D,std::allocator<Point2D>>>>>
                  ((vector<Point2D,std::allocator<Point2D>> *)__return_storage_ptr__,
                   *(undefined8 *)
                    &(__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)
                     ._M_impl.super__Vector_impl_data._M_finish,
                   local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
LAB_001441a6:
      if (local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
LAB_001441b4:
  pdVar12 = Point2D::operator[](search,this->dim);
  dVar4 = *pdVar12;
  pdVar12 = Point2D::operator[](sizes,this->dim);
  dVar5 = *pdVar12;
  pdVar12 = Point2D::operator[](search,this->dim);
  dVar6 = *pdVar12;
  pdVar12 = Point2D::operator[](sizes,this->dim);
  if ((dVar3 < dVar2) ||
     ((this->childPositive)._M_t.
      super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
      (LazyKdTree<Point2D> *)0x0)) {
    if (dVar2 <= dVar3) {
      return __return_storage_ptr__;
    }
    if ((this->childNegative)._M_t.
        super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
        .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
        (LazyKdTree<Point2D> *)0x0) {
      return __return_storage_ptr__;
    }
    pdVar12 = Point2D::operator[]((this->data)._M_t.
                                  super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t
                                  .super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
                                  super__Head_base<0UL,_Point2D_*,_false>._M_head_impl,this->dim);
    if (*pdVar12 < dVar5 * -0.5 + dVar4) {
      return __return_storage_ptr__;
    }
    in_box(&local_88,
           (this->childNegative)._M_t.
           super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
           .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl,search,sizes
          );
    pvVar15 = *(void **)&__return_storage_ptr__->
                         super__Vector_base<Point2D,_std::allocator<Point2D>_>;
    pvVar9 = *(void **)&(__return_storage_ptr__->
                        super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
    if (pvVar15 != pvVar9) {
      std::vector<Point2D,_std::allocator<Point2D>_>::reserve
                (__return_storage_ptr__,
                 ((long)local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_start >> 4) + ((long)pvVar9 - (long)pvVar15 >> 4)
                );
      std::vector<Point2D,std::allocator<Point2D>>::
      _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<Point2D*,std::vector<Point2D,std::allocator<Point2D>>>>>
                ((vector<Point2D,std::allocator<Point2D>> *)__return_storage_ptr__,
                 *(undefined8 *)
                  &(__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                 local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      goto LAB_0014438d;
    }
  }
  else {
    dVar2 = *pdVar12;
    pdVar12 = Point2D::operator[]((this->data)._M_t.
                                  super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t
                                  .super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
                                  super__Head_base<0UL,_Point2D_*,_false>._M_head_impl,this->dim);
    if (dVar2 * 0.5 + dVar6 < *pdVar12) {
      return __return_storage_ptr__;
    }
    in_box(&local_88,
           (this->childPositive)._M_t.
           super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
           .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl,search,sizes
          );
    pvVar15 = *(void **)&__return_storage_ptr__->
                         super__Vector_base<Point2D,_std::allocator<Point2D>_>;
    pvVar9 = *(void **)&(__return_storage_ptr__->
                        super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
    if (pvVar15 != pvVar9) {
      std::vector<Point2D,_std::allocator<Point2D>_>::reserve
                (__return_storage_ptr__,
                 ((long)local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_start >> 4) + ((long)pvVar9 - (long)pvVar15 >> 4)
                );
      std::vector<Point2D,std::allocator<Point2D>>::
      _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<Point2D*,std::vector<Point2D,std::allocator<Point2D>>>>>
                ((vector<Point2D,std::allocator<Point2D>> *)__return_storage_ptr__,
                 *(undefined8 *)
                  &(__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                 local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      goto LAB_0014438d;
    }
  }
  *(pointer *)&__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_> =
       local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   &(__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
    super__Vector_impl_data._M_finish =
       local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)
   &(__return_storage_ptr__->super__Vector_base<Point2D,_std::allocator<Point2D>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
       local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pvVar15 == (void *)0x0) {
    return __return_storage_ptr__;
  }
  operator_delete(pvVar15);
LAB_0014438d:
  if (local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<P> in_box(P const& search, P const& sizes)
    {
        ensure_evaluated();

        for (size_t i = 0; i < P::dimensions(); ++i) {
            if (sizes[i] <= 0.0)
                return std::vector<P>(); // no real search if one dimension size is <= 0
        }

        std::vector<P> res; // all points within the box

        bool inBox = true;
        for (size_t i = 0; i < P::dimensions() && inBox; ++i)
            inBox = dimension_dist(search, *(data.get()), i) <= 0.5 * sizes[i];

        if (inBox) res.push_back(*(data.get()));

        if (is_leaf()) return res; // no children, return result

        // decide which side to check and recurse into it
        const auto comp = dimension_compare(search, *(data.get()), dim);
        if (comp == NEGATIVE) {
            if (childNegative)
                move_append(childNegative->in_box(search, sizes), res);
        } else if (childPositive) {
            move_append(childPositive->in_box(search, sizes), res);
        }

        const double borderNegative = search[dim] - 0.5 * sizes[dim];
        const double borderPositive = search[dim] + 0.5 * sizes[dim];

        // check whether distances to other side are smaller than radius
        // and recurse into the "wrong" direction, to check for possibly additional
        // candidates
        if (comp == NEGATIVE && childPositive) {
            if (borderPositive >= (*data.get())[dim])
                move_append(childPositive->in_box(search, sizes), res);
        } else if (comp == POSITIVE && childNegative) {
            if (borderNegative <= (*data.get())[dim])
                move_append(childNegative->in_box(search, sizes), res);
        }

        return res;
    }